

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O1

void uv_free_cpu_info(uv_cpu_info_t *cpu_infos,int count)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  
  if (0 < count) {
    piVar2 = __errno_location();
    lVar3 = 0;
    do {
      iVar1 = *piVar2;
      (*(code *)uv__allocator_3)(*(undefined8 *)((long)&cpu_infos->model + lVar3));
      *piVar2 = iVar1;
      lVar3 = lVar3 + 0x38;
    } while ((ulong)(uint)count * 0x38 - lVar3 != 0);
  }
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  (*(code *)uv__allocator_3)(cpu_infos);
  *piVar2 = iVar1;
  return;
}

Assistant:

void uv_free_cpu_info(uv_cpu_info_t* cpu_infos, int count) {
  int i;

  for (i = 0; i < count; i++)
    uv__free(cpu_infos[i].model);

  uv__free(cpu_infos);
}